

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colormapper.h
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
irwincolor::Map::map
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,Map *this,
          double y)

{
  string *__lhs;
  float fVar1;
  pointer pdVar2;
  pointer pfVar3;
  undefined8 *puVar4;
  uchar uVar5;
  bool bVar6;
  undefined1 uVar7;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> _Var8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  float fVar12;
  double dVar13;
  double dVar14;
  vector<float,_std::allocator<float>_> rgb0;
  vector<float,_std::allocator<float>_> rgb1;
  vector<float,_std::allocator<float>_> msh0;
  double local_78;
  vector<float,_std::allocator<float>_> msh1;
  vector<float,_std::allocator<float>_> msh;
  vector<float,_std::allocator<float>_> rgbf;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,3,(allocator_type *)&rgb0);
  if (y <= 1.0) {
    dVar13 = 0.0;
    if (0.0 <= y) {
      dVar13 = y;
    }
    local_78 = 1.0;
    if (dVar13 <= 1.0) {
      local_78 = dVar13;
    }
    if (this->inv == true) {
      local_78 = 1.0 - local_78;
    }
    if (this->paraView != true) {
      uVar10 = this->imap;
      if ((ulong)uVar10 < 3) {
        (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
        _M_impl.super__Vector_impl_data._M_start[uVar10] =
             (uchar)(int)(local_78 * 255.99899291992188);
        return __return_storage_ptr__;
      }
      if (uVar10 - 3 < 3) {
        rgb0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start._0_1_ = 0xff;
        rgb0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start._1_1_ = 0xff;
        rgb0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start._2_1_ = 0xff;
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_assign_aux<unsigned_char_const*>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                   &rgb0);
        (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
        _M_impl.super__Vector_impl_data._M_start[(long)this->imap + -3] =
             (uchar)(int)(local_78 * 255.99899291992188);
        return __return_storage_ptr__;
      }
      dVar13 = local_78 * 6.0;
      dVar14 = fmod(dVar13,2.0);
      uVar7 = (undefined1)(int)((1.0 - ABS(dVar14 + -1.0)) * 255.99899291992188);
      rgb0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start._1_1_ = uVar7;
      if (dVar13 < 1.0) {
        rgb0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start._0_1_ = 0xff;
        rgb0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start._2_1_ = 0;
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_assign_aux<unsigned_char_const*>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                   &rgb0);
        return __return_storage_ptr__;
      }
      rgb0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start._0_1_ = uVar7;
      if (2.0 <= dVar13) {
        rgb0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start._2_1_ = uVar7;
        if (dVar13 < 3.0) {
          rgb0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_start._0_1_ = 0;
          rgb0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_start._1_1_ = 0xff;
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_assign_aux<unsigned_char_const*>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                     &rgb0);
          return __return_storage_ptr__;
        }
        if (4.0 <= dVar13) {
          if (5.0 <= dVar13) {
            rgb0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_start._0_1_ = 0xff;
            rgb0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_start._1_1_ = 0;
            std::vector<unsigned_char,std::allocator<unsigned_char>>::
            _M_assign_aux<unsigned_char_const*>
                      ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__
                       ,&rgb0);
            return __return_storage_ptr__;
          }
          rgb0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_start._1_1_ = 0;
          rgb0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_start._2_1_ = 0xff;
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_assign_aux<unsigned_char_const*>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                     &rgb0);
          return __return_storage_ptr__;
        }
        rgb0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start._0_1_ = 0;
        rgb0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start._2_1_ = 0xff;
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_assign_aux<unsigned_char_const*>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                   &rgb0);
        return __return_storage_ptr__;
      }
      rgb0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start._1_1_ = 0xff;
      rgb0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start._2_1_ = 0;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,&rgb0
                );
      return __return_storage_ptr__;
    }
    _Var8 = std::
            __lower_bound<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,double,__gnu_cxx::__ops::_Iter_less_val>
                      ((this->x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       (this->x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_78);
    pdVar2 = (this->x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar10 = (uint)((long)_Var8._M_current - (long)pdVar2 >> 3);
    if (0 < (int)uVar10) {
      uVar11 = uVar10 - 1;
      uVar10 = uVar10 & 0x7fffffff;
      dVar13 = (local_78 - pdVar2[uVar11]) / (pdVar2[uVar10] - pdVar2[uVar11]);
      __lhs = &this->space;
      bVar6 = std::operator==(__lhs,"Diverging");
      if (bVar6) {
        std::vector<float,_std::allocator<float>_>::vector(&rgb0,3,(allocator_type *)&rgb1);
        puVar4 = (undefined8 *)
                 CONCAT53(rgb0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start._3_5_,
                          CONCAT12(rgb0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                   super__Vector_impl_data._M_start._2_1_,
                                   CONCAT11(rgb0.super__Vector_base<float,_std::allocator<float>_>.
                                            _M_impl.super__Vector_impl_data._M_start._1_1_,
                                            rgb0.super__Vector_base<float,_std::allocator<float>_>.
                                            _M_impl.super__Vector_impl_data._M_start._0_1_)));
        *puVar4 = CONCAT44((float)(this->g).super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar11],
                           (float)(this->r).super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar11]);
        *(float *)(puVar4 + 1) =
             (float)(this->b).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar11];
        std::vector<float,_std::allocator<float>_>::vector(&rgb1,3,(allocator_type *)&msh0);
        *(ulong *)rgb1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start =
             CONCAT44((float)(this->g).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar10],
                      (float)(this->r).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar10]);
        rgb1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[2] = (float)(this->b).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar10];
        rgb2msh(&msh0,&rgb0);
        rgb2msh(&msh1,&rgb1);
        fVar1 = msh1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start[2];
        fVar12 = msh0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start[2];
        if (pi < (double)ABS(fVar1 - fVar12)) {
          pfVar3 = msh0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (fVar1 <= fVar12) {
            pfVar3 = msh1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start;
          }
          if (fVar1 <= fVar12) {
            fVar12 = fVar1;
          }
          pfVar3[2] = (float)(pi + pi + (double)fVar12);
        }
        std::vector<float,_std::allocator<float>_>::vector(&msh,3,(allocator_type *)&rgbf);
        dVar14 = 1.0 - dVar13;
        *msh.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_start = (float)((double)*msh0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                     super__Vector_impl_data._M_start * dVar14 +
                           (double)*msh1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                    super__Vector_impl_data._M_start * dVar13);
        msh.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[1] = (float)((double)msh0.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                      .super__Vector_impl_data._M_start[1] * dVar14 +
                             (double)msh1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                     super__Vector_impl_data._M_start[1] * dVar13);
        msh.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[2] = (float)((double)msh0.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                      .super__Vector_impl_data._M_start[2] * dVar14 +
                             (double)msh1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                     super__Vector_impl_data._M_start[2] * dVar13);
        msh2rgb(&rgbf,&msh);
LAB_001078d3:
        *(__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
         ._M_impl.super__Vector_impl_data._M_start =
             (uchar)(int)(*rgbf.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start * 255.999);
        (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
        _M_impl.super__Vector_impl_data._M_start[1] =
             (uchar)(int)(rgbf.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start[1] * 255.999);
        (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
        _M_impl.super__Vector_impl_data._M_start[2] =
             (uchar)(int)(rgbf.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start[2] * 255.999);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  (&rgbf.super__Vector_base<float,_std::allocator<float>_>);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  (&msh.super__Vector_base<float,_std::allocator<float>_>);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  (&msh1.super__Vector_base<float,_std::allocator<float>_>);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  (&msh0.super__Vector_base<float,_std::allocator<float>_>);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  (&rgb1.super__Vector_base<float,_std::allocator<float>_>);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  (&rgb0.super__Vector_base<float,_std::allocator<float>_>);
        return __return_storage_ptr__;
      }
      bVar6 = std::operator==(__lhs,"Lab");
      if (bVar6) {
        std::vector<float,_std::allocator<float>_>::vector(&rgb0,3,(allocator_type *)&rgb1);
        puVar4 = (undefined8 *)
                 CONCAT53(rgb0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start._3_5_,
                          CONCAT12(rgb0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                   super__Vector_impl_data._M_start._2_1_,
                                   CONCAT11(rgb0.super__Vector_base<float,_std::allocator<float>_>.
                                            _M_impl.super__Vector_impl_data._M_start._1_1_,
                                            rgb0.super__Vector_base<float,_std::allocator<float>_>.
                                            _M_impl.super__Vector_impl_data._M_start._0_1_)));
        *puVar4 = CONCAT44((float)(this->g).super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar11],
                           (float)(this->r).super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar11]);
        *(float *)(puVar4 + 1) =
             (float)(this->b).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar11];
        std::vector<float,_std::allocator<float>_>::vector(&rgb1,3,(allocator_type *)&msh0);
        *(ulong *)rgb1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start =
             CONCAT44((float)(this->g).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar10],
                      (float)(this->r).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar10]);
        rgb1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[2] = (float)(this->b).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar10];
        rgb2lab(&msh0,&rgb0);
        rgb2lab(&msh1,&rgb1);
        std::vector<float,_std::allocator<float>_>::vector(&msh,3,(allocator_type *)&rgbf);
        dVar14 = 1.0 - dVar13;
        *msh.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_start = (float)((double)*msh0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                     super__Vector_impl_data._M_start * dVar14 +
                           (double)*msh1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                    super__Vector_impl_data._M_start * dVar13);
        msh.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[1] = (float)((double)msh0.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                      .super__Vector_impl_data._M_start[1] * dVar14 +
                             (double)msh1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                     super__Vector_impl_data._M_start[1] * dVar13);
        msh.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[2] = (float)((double)msh0.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                      .super__Vector_impl_data._M_start[2] * dVar14 +
                             (double)msh1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                     super__Vector_impl_data._M_start[2] * dVar13);
        lab2rgb(&rgbf,&msh);
        goto LAB_001078d3;
      }
      bVar6 = std::operator==(__lhs,"HSV");
      if (bVar6) {
        std::vector<float,_std::allocator<float>_>::vector(&rgb0,3,(allocator_type *)&rgb1);
        puVar4 = (undefined8 *)
                 CONCAT53(rgb0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start._3_5_,
                          CONCAT12(rgb0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                   super__Vector_impl_data._M_start._2_1_,
                                   CONCAT11(rgb0.super__Vector_base<float,_std::allocator<float>_>.
                                            _M_impl.super__Vector_impl_data._M_start._1_1_,
                                            rgb0.super__Vector_base<float,_std::allocator<float>_>.
                                            _M_impl.super__Vector_impl_data._M_start._0_1_)));
        *puVar4 = CONCAT44((float)(this->g).super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar11],
                           (float)(this->r).super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar11]);
        *(float *)(puVar4 + 1) =
             (float)(this->b).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar11];
        std::vector<float,_std::allocator<float>_>::vector(&rgb1,3,(allocator_type *)&msh0);
        *(ulong *)rgb1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start =
             CONCAT44((float)(this->g).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar10],
                      (float)(this->r).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar10]);
        rgb1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[2] = (float)(this->b).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar10];
        rgb2hsv(&msh0,&rgb0);
        rgb2hsv(&msh1,&rgb1);
        std::vector<float,_std::allocator<float>_>::vector(&msh,3,(allocator_type *)&rgbf);
        dVar14 = 1.0 - dVar13;
        *msh.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_start = (float)((double)*msh0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                     super__Vector_impl_data._M_start * dVar14 +
                           (double)*msh1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                    super__Vector_impl_data._M_start * dVar13);
        msh.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[1] = (float)((double)msh0.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                      .super__Vector_impl_data._M_start[1] * dVar14 +
                             (double)msh1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                     super__Vector_impl_data._M_start[1] * dVar13);
        msh.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[2] = (float)((double)msh0.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                      .super__Vector_impl_data._M_start[2] * dVar14 +
                             (double)msh1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                     super__Vector_impl_data._M_start[2] * dVar13);
        hsv2rgb(&rgbf,&msh);
        goto LAB_001078d3;
      }
      dVar14 = 1.0 - dVar13;
      pdVar2 = (this->r).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      *(__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
       _M_impl.super__Vector_impl_data._M_start =
           (uchar)(int)((pdVar2[uVar11] * dVar14 + pdVar2[uVar10] * dVar13) * 255.99899291992188);
      pdVar2 = (this->g).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_start[1] =
           (uchar)(int)((pdVar2[uVar11] * dVar14 + pdVar2[uVar10] * dVar13) * 255.99899291992188);
      pdVar2 = (this->b).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar5 = (uchar)(int)((dVar14 * pdVar2[uVar11] + dVar13 * pdVar2[uVar10]) * 255.99899291992188)
      ;
      goto LAB_0010728d;
    }
    lVar9 = ((long)_Var8._M_current - (long)pdVar2) * 0x20000000 >> 0x1d;
    *(__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
     _M_impl.super__Vector_impl_data._M_start =
         (uchar)(int)(*(double *)
                       ((long)(this->r).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start + lVar9) * 255.99899291992188);
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_start[1] =
         (uchar)(int)(*(double *)
                       ((long)(this->g).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start + lVar9) * 255.99899291992188);
    dVar13 = *(double *)
              ((long)(this->b).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar9);
  }
  else {
    *(__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
     _M_impl.super__Vector_impl_data._M_start = (uchar)(int)(this->nanr * 255.99899291992188);
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_start[1] = (uchar)(int)(this->nang * 255.99899291992188);
    dVar13 = this->nanb;
  }
  uVar5 = (uchar)(int)(dVar13 * 255.99899291992188);
LAB_0010728d:
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start[2] = uVar5;
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> map(double y) const
	{
		// "const" after the function name here means that this
		// method does not modify the class.

		// Almost, we need to floor result
		const float twofivesix = 255.999;

		// Map y in range [0, 1] (clipped if outside) to an RGB triple
		// in range [0, 255].

		std::vector<uint8_t> rgb(3);

		// Map out-of-range values to NaN color.
		if (y > 1.0)
		{
			rgb[0] = twofivesix * nanr;
			rgb[1] = twofivesix * nang;
			rgb[2] = twofivesix * nanb;
			return rgb;
		}

		y = std::min(std::max(y, 0.0), 1.0);

		if (inv)
			y = 1 - y;

		//// Note, using a function like sqrt here can skew the map
		//// towards the 255 end of the spectrum, while squaring can shift
		//// towards 0.
		//
		// TODO:  make an option for the exponent here.  It's useful for
		// things like black-to-red where the bright reds are
		// imperceptibly different from one another and a larger
		// exponent (e.g. 3 or 4) is helpful, while for HSV 1 is OK.
		//
		//y = sqrt(y);
		//y = y * y * y * y;
		if (paraView)
		{
			auto iter = std::lower_bound(x.begin(), x.end(), y);  // binary search
			int i = std::distance(x.begin(), iter);
			//std::cout << "i = " << i << "\n";
			//std::cout << "y = " << y << "\n";
			//std::cout << "iter = " << *iter << "\n";
			if (i > 0)
			{
				double f = (y - x[i-1]) / (x[i] - x[i-1]);
				if (space == "Diverging")
				{
					// TODO:  this may not be 100% correct, it's hard to
					// tell.  The adjustHue function described in the
					// reference may be required.  But there's only one
					// colormap in my XML files that uses this space
					// anyway.

					std::vector<float> rgb0(3);
					rgb0[0] = r[i-1];
					rgb0[1] = g[i-1];
					rgb0[2] = b[i-1];

					std::vector<float> rgb1(3);
					rgb1[0] = r[i];
					rgb1[1] = g[i];
					rgb1[2] = b[i];

					auto msh0 = rgb2msh(rgb0);
					auto msh1 = rgb2msh(rgb1);

					// Interpolating between an angle close to
					// +pi and an angle close to -pi should not
					// give a result near zero.
					if (abs(msh1[2] - msh0[2]) > pi)
					{
						if (msh0[2] < msh1[2])
							msh0[2] += 2 * pi;
						else
							msh1[2] += 2 * pi;
					}

					std::vector<float> msh(3);
					msh[0] = (1.0 - f) * msh0[0] + f * msh1[0];
					msh[1] = (1.0 - f) * msh0[1] + f * msh1[1];
					msh[2] = (1.0 - f) * msh0[2] + f * msh1[2];

					auto rgbf = msh2rgb(msh);

					rgb[0] = twofivesix * rgbf[0];
					rgb[1] = twofivesix * rgbf[1];
					rgb[2] = twofivesix * rgbf[2];

					////auto xyz0 = rgb2xyz(rgb0);
					////auto xyz  = msh2xyz(msh);
					////auto xyz1 = rgb2xyz(rgb1);
					//std::cout << "rgb0 = " << rgb0 << std::endl;
					//std::cout << "rgb  = " << (int) rgb[0] << " " << (int) rgb[1] << " " << (int) rgb[2] << std::endl;
					//std::cout << "rgbf = " << rgbf << std::endl;
					//std::cout << "rgb1 = " << rgb1 << std::endl;
					//std::cout << "msh0 = " << msh0 << std::endl;
					//std::cout << "msh  = " << msh  << std::endl;
					//std::cout << "msh1 = " << msh1 << std::endl;
					////std::cout << "xyz0 = " << xyz0 << std::endl;
					////std::cout << "xyz  = " << xyz  << std::endl;
					////std::cout << "xyz1 = " << xyz1 << std::endl;
					//std::cout << std::endl;
				}
				else if (space == "Lab")
				{
					std::vector<float> rgb0(3);
					rgb0[0] = r[i-1];
					rgb0[1] = g[i-1];
					rgb0[2] = b[i-1];

					std::vector<float> rgb1(3);
					rgb1[0] = r[i];
					rgb1[1] = g[i];
					rgb1[2] = b[i];

					auto lab0 = rgb2lab(rgb0);
					auto lab1 = rgb2lab(rgb1);

					std::vector<float> lab(3);
					lab[0] = (1.0 - f) * lab0[0] + f * lab1[0];
					lab[1] = (1.0 - f) * lab0[1] + f * lab1[1];
					lab[2] = (1.0 - f) * lab0[2] + f * lab1[2];

					auto rgbf = lab2rgb(lab);

					rgb[0] = twofivesix * rgbf[0];
					rgb[1] = twofivesix * rgbf[1];
					rgb[2] = twofivesix * rgbf[2];

					//auto xyz0 = rgb2xyz(rgb0);
					//auto xyz  = lab2xyz(lab);
					//auto xyz1 = rgb2xyz(rgb1);
					//std::cout << "rgb0 = " << rgb0 << std::endl;
					//std::cout << "rgb  = " << (int) rgb[0] << " " << (int) rgb[1] << " " << (int) rgb[2] << std::endl;
					//std::cout << "rgbf = " << rgbf << std::endl;
					//std::cout << "rgb1 = " << rgb1 << std::endl;
					//std::cout << "lab0 = " << lab0 << std::endl;
					//std::cout << "lab  = " << lab  << std::endl;
					//std::cout << "lab1 = " << lab1 << std::endl;
					//std::cout << "xyz0 = " << xyz0 << std::endl;
					//std::cout << "xyz  = " << xyz  << std::endl;
					//std::cout << "xyz1 = " << xyz1 << std::endl;
					//std::cout << std::endl;
				}
				else if (space == "HSV")
				{
					std::vector<float> rgb0(3);
					rgb0[0] = r[i-1];
					rgb0[1] = g[i-1];
					rgb0[2] = b[i-1];

					std::vector<float> rgb1(3);
					rgb1[0] = r[i];
					rgb1[1] = g[i];
					rgb1[2] = b[i];

					auto hsv0 = rgb2hsv(rgb0);
					auto hsv1 = rgb2hsv(rgb1);

					std::vector<float> hsv(3);
					hsv[0] = (1.0 - f) * hsv0[0] + f * hsv1[0];
					hsv[1] = (1.0 - f) * hsv0[1] + f * hsv1[1];
					hsv[2] = (1.0 - f) * hsv0[2] + f * hsv1[2];

					auto rgbf = hsv2rgb(hsv);

					rgb[0] = twofivesix * rgbf[0];
					rgb[1] = twofivesix * rgbf[1];
					rgb[2] = twofivesix * rgbf[2];
				}
				else  // RGB
				{
					// TODO:  add a warning for unrecognized color spaces.
					rgb[0] = twofivesix * ((1.0 - f) * r[i-1] + f * r[i]);
					rgb[1] = twofivesix * ((1.0 - f) * g[i-1] + f * g[i]);
					rgb[2] = twofivesix * ((1.0 - f) * b[i-1] + f * b[i]);
				}
			}
			else
			{
				rgb[0] = twofivesix * r[i];
				rgb[1] = twofivesix * g[i];
				rgb[2] = twofivesix * b[i];
			}
		}
		else if (0 <= imap && imap < 3)
		{
			// Black-to-(red|green|blue) map
			//            0    1     2
			rgb[imap] = y * twofivesix;
		}
		else if (3 <= imap && imap < 6)
		{
			// (cyan|magenta|yellow)-to-white map
			//    3     4       5
			rgb = {twofivefive, twofivefive, twofivefive};
			rgb[imap - 3] = y * twofivesix;
		}
		else
		{
			// HSV
			uint8_t c = twofivefive;
			double hp = 6.0 * y;
			uint8_t xu = twofivesix * (1.0 - abs(fmod(hp, 2.0) - 1.0));
			if (hp < 1.0)
				rgb = {c, xu, 0};
			else if (hp < 2.0)
				rgb = {xu, c, 0};
			else if (hp < 3.0)
				rgb = {0, c, xu};
			else if (hp < 4.0)
				rgb = {0, xu, c};
			else if (hp < 5.0)
				rgb = {xu, 0, c};
			else
				rgb = {c, 0, xu};
		}

		//std::cout << "y = " << y << "\n";
		//std::cout << "rgb = " << rgb << "\n";

		return rgb;
	}